

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::AddCrossing
          (CrossingProcessor *this,SourceEdgeCrossing *crossing)

{
  InputEdgeId local_2c;
  pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_> local_28;
  pair<S2BooleanOperation::SourceId,_bool> *local_18;
  SourceEdgeCrossing *crossing_local;
  CrossingProcessor *this_local;
  
  local_18 = crossing;
  crossing_local = (SourceEdgeCrossing *)this;
  local_2c = input_edge_id(this);
  local_28 = std::make_pair<int,std::pair<S2BooleanOperation::SourceId,bool>const&>
                       (&local_2c,local_18);
  std::
  vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
  ::push_back(&this->source_edge_crossings_,&local_28);
  return;
}

Assistant:

void AddCrossing(const SourceEdgeCrossing& crossing) {
    source_edge_crossings_.push_back(make_pair(input_edge_id(), crossing));
  }